

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2skin.cpp
# Opt level: O2

int32 rw::ps2::findVertexSkin(Geometry *g,uint32 *flags,uint32 mask,Vertex *v)

{
  float32 *pfVar1;
  float fVar2;
  TexCoords *pTVar3;
  TexCoords *pTVar4;
  bool32 bVar5;
  uint uVar6;
  V3d *v1;
  V3d *v1_00;
  long lVar7;
  float *pfVar8;
  long local_70;
  RGBA *local_48;
  
  lVar7 = *(long *)((long)g->texCoords + (long)skinGlobals + -0x38);
  if (lVar7 == 0) {
    lVar7 = 0;
    local_70 = 0;
  }
  else {
    local_70 = *(long *)(lVar7 + 0x20);
    lVar7 = *(long *)(lVar7 + 0x28);
  }
  v1 = g->morphTargets->vertices;
  v1_00 = g->morphTargets->normals;
  local_48 = g->colors;
  pTVar3 = g->texCoords[0];
  pTVar4 = g->texCoords[1];
  pfVar8 = (float *)(lVar7 + 0xc);
  lVar7 = 0;
  do {
    if (g->numVertices <= lVar7) {
      return -1;
    }
    uVar6 = 0xffffffff;
    if (flags != (uint32 *)0x0) {
      uVar6 = flags[lVar7];
    }
    uVar6 = uVar6 & mask;
    if (((((uVar6 & 1) == 0) || (bVar5 = equal(v1,&v->p), bVar5 != 0)) &&
        (((uVar6 & 0x10) == 0 || (bVar5 = equal(v1_00,&v->n), bVar5 != 0)))) &&
       (((uVar6 >> 8 & 1) == 0 || (bVar5 = equal(local_48,&v->c), bVar5 != 0)))) {
      if ((uVar6 >> 0xc & 1) == 0) {
LAB_00126e1c:
        if ((uVar6 >> 0xd & 1) == 0) {
LAB_00126e63:
          if ((uVar6 >> 0x10 & 1) == 0) {
LAB_00126f29:
            return (int32)lVar7;
          }
          if ((pfVar8[-3] == (float)v->w[0]) && (!NAN(pfVar8[-3]) && !NAN((float)v->w[0]))) {
            if ((pfVar8[-2] == (float)v->w[1]) && (!NAN(pfVar8[-2]) && !NAN((float)v->w[1]))) {
              if ((pfVar8[-1] == (float)v->w[2]) && (!NAN(pfVar8[-1]) && !NAN((float)v->w[2]))) {
                if ((*pfVar8 == (float)v->w[3]) &&
                   ((((!NAN(*pfVar8) && !NAN((float)v->w[3]) &&
                      (*(uint8 *)(local_70 + lVar7 * 4) == v->i[0])) &&
                     (*(uint8 *)(local_70 + 1 + lVar7 * 4) == v->i[1])) &&
                    ((*(uint8 *)(local_70 + 2 + lVar7 * 4) == v->i[2] &&
                     (*(uint8 *)(local_70 + 3 + lVar7 * 4) == v->i[3])))))) goto LAB_00126f29;
              }
            }
          }
        }
        else {
          fVar2 = (float)pTVar4[lVar7].u;
          if ((fVar2 == (float)(v->t1).u) && (!NAN(fVar2) && !NAN((float)(v->t1).u))) {
            fVar2 = (float)pTVar4[lVar7].v;
            pfVar1 = &(v->t1).v;
            if ((fVar2 == (float)*pfVar1) && (!NAN(fVar2) && !NAN((float)*pfVar1)))
            goto LAB_00126e63;
          }
        }
      }
      else {
        fVar2 = (float)pTVar3[lVar7].u;
        if ((fVar2 == (float)(v->t).u) && (!NAN(fVar2) && !NAN((float)(v->t).u))) {
          fVar2 = (float)pTVar3[lVar7].v;
          pfVar1 = &(v->t).v;
          if ((fVar2 == (float)*pfVar1) && (!NAN(fVar2) && !NAN((float)*pfVar1))) goto LAB_00126e1c;
        }
      }
    }
    v1 = v1 + 1;
    v1_00 = v1_00 + 1;
    local_48 = local_48 + 1;
    lVar7 = lVar7 + 1;
    pfVar8 = pfVar8 + 4;
  } while( true );
}

Assistant:

int32
findVertexSkin(Geometry *g, uint32 flags[], uint32 mask, Vertex *v)
{
	Skin *skin = Skin::get(g);
	float32 *wghts = nil;
	uint8 *inds = nil;
	if(skin){
		wghts = skin->weights;
		inds = skin->indices;
	}

	V3d *verts = g->morphTargets[0].vertices;
	TexCoords *tex = g->texCoords[0];
	TexCoords *tex1 = g->texCoords[1];
	V3d *norms = g->morphTargets[0].normals;
	RGBA *cols = g->colors;

	for(int32 i = 0; i < g->numVertices; i++){
		uint32 flag = flags ? flags[i] : ~0;
		if(mask & flag & 0x1 && !equal(*verts, v->p))
			goto cont;
		if(mask & flag & 0x10 && !equal(*norms, v->n))
			goto cont;
		if(mask & flag & 0x100 && !equal(*cols, v->c))
			goto cont;
		if(mask & flag & 0x1000 && !equal(*tex, v->t))
			goto cont;
		if(mask & flag & 0x2000 && !equal(*tex1, v->t1))
			goto cont;
		if(mask & flag & 0x10000 &&
		   !(wghts[0] == v->w[0] && wghts[1] == v->w[1] &&
		     wghts[2] == v->w[2] && wghts[3] == v->w[3] &&
		     inds[0] == v->i[0] && inds[1] == v->i[1] &&
		     inds[2] == v->i[2] && inds[3] == v->i[3]))
			goto cont;
		return i;
	cont:
		verts++;
		tex++;
		tex1++;
		norms++;
		cols++;
		wghts += 4;
		inds += 4;
	}
	return -1;
}